

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos1,size_type n1,
          char *s,size_type n2)

{
  basic_string_view<char,_std::char_traits<char>_> other;
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  const_pointer local_50;
  size_type local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  size_type local_30;
  size_type n2_local;
  char *s_local;
  size_type n1_local;
  size_type pos1_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  
  local_30 = n2;
  n2_local = (size_type)s;
  s_local = (char *)n1;
  n1_local = pos1;
  pos1_local = (size_type)this;
  local_40 = substr(this,pos1,n1);
  basic_string_view(&local_60,(char *)n2_local,local_30);
  local_50 = local_60.data_;
  local_48 = local_60.size_;
  other.size_ = local_60.size_;
  other.data_ = local_60.data_;
  iVar1 = compare(&local_40,other);
  return iVar1;
}

Assistant:

nssv_constexpr int compare( size_type pos1, size_type n1, CharT const * s, size_type n2 ) const // (6)
    {
        return substr( pos1, n1 ).compare( basic_string_view( s, n2 ) );
    }